

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qgraphicswidget.cpp
# Opt level: O2

void QGraphicsWidget::setTabOrder(QWindow *first,QWindow *second)

{
  long lVar1;
  QWindow *pQVar2;
  long lVar3;
  long lVar4;
  long lVar5;
  QGraphicsScene *pQVar6;
  QGraphicsScene *pQVar7;
  char *pcVar8;
  long in_FS_OFFSET;
  char local_50 [24];
  char *local_38;
  long local_30;
  
  local_30 = *(long *)(in_FS_OFFSET + 0x28);
  if (first == (QWindow *)0x0 && second == (QWindow *)0x0) {
    pcVar8 = "QGraphicsWidget::setTabOrder(0, 0) is undefined";
  }
  else {
    if (first == (QWindow *)0x0 || second == (QWindow *)0x0) {
      if (first != (QWindow *)0x0) goto LAB_005c7110;
      pQVar6 = QGraphicsItem::scene((QGraphicsItem *)(second + 0x10));
      if (pQVar6 != (QGraphicsScene *)0x0) {
        *(QWindow **)(*(long *)&pQVar6->field_0x8 + 0x1a0) = second;
        goto LAB_005c7214;
      }
    }
    else {
      pQVar6 = QGraphicsItem::scene((QGraphicsItem *)(first + 0x10));
      pQVar7 = QGraphicsItem::scene((QGraphicsItem *)(second + 0x10));
      if (pQVar6 != pQVar7) {
        local_50[0] = '\x02';
        local_50[1] = '\0';
        local_50[2] = '\0';
        local_50[3] = '\0';
        local_50[0x14] = '\0';
        local_50[0x15] = '\0';
        local_50[0x16] = '\0';
        local_50[0x17] = '\0';
        local_50[4] = '\0';
        local_50[5] = '\0';
        local_50[6] = '\0';
        local_50[7] = '\0';
        local_50[8] = '\0';
        local_50[9] = '\0';
        local_50[10] = '\0';
        local_50[0xb] = '\0';
        local_50[0xc] = '\0';
        local_50[0xd] = '\0';
        local_50[0xe] = '\0';
        local_50[0xf] = '\0';
        local_50[0x10] = '\0';
        local_50[0x11] = '\0';
        local_50[0x12] = '\0';
        local_50[0x13] = '\0';
        local_38 = "default";
        pQVar6 = QGraphicsItem::scene((QGraphicsItem *)(first + 0x10));
        pQVar7 = QGraphicsItem::scene((QGraphicsItem *)(second + 0x10));
        QMessageLogger::warning
                  (local_50,"QGraphicsWidget::setTabOrder: scenes %p and %p are different",pQVar6,
                   pQVar7);
        goto LAB_005c7214;
      }
LAB_005c7110:
      pQVar6 = QGraphicsItem::scene((QGraphicsItem *)(first + 0x10));
      if (pQVar6 != (QGraphicsScene *)0x0) {
        if (second == (QWindow *)0x0) {
          *(undefined8 *)(*(long *)&pQVar6->field_0x8 + 0x1a0) =
               *(undefined8 *)(*(long *)(first + 0x18) + 0x1c0);
        }
        else {
          lVar1 = *(long *)(first + 0x18);
          pQVar2 = *(QWindow **)(lVar1 + 0x1c0);
          if (pQVar2 != second) {
            lVar3 = *(long *)(second + 0x18);
            lVar4 = *(long *)(lVar3 + 0x1c0);
            lVar5 = *(long *)(lVar3 + 0x1c8);
            *(QWindow **)(*(long *)(pQVar2 + 0x18) + 0x1c8) = second;
            *(QWindow **)(lVar1 + 0x1c0) = second;
            *(QWindow **)(lVar3 + 0x1c0) = pQVar2;
            *(QWindow **)(lVar3 + 0x1c8) = first;
            *(long *)(*(long *)(lVar5 + 0x18) + 0x1c0) = lVar4;
            *(long *)(*(long *)(lVar4 + 0x18) + 0x1c8) = lVar5;
          }
        }
        goto LAB_005c7214;
      }
    }
    pcVar8 = 
    "QGraphicsWidget::setTabOrder: assigning tab order from/to the scene requires the item to be in a scene."
    ;
  }
  local_38 = "default";
  local_50[0x14] = '\0';
  local_50[0x15] = '\0';
  local_50[0x16] = '\0';
  local_50[0x17] = '\0';
  local_50[0xc] = '\0';
  local_50[0xd] = '\0';
  local_50[0xe] = '\0';
  local_50[0xf] = '\0';
  local_50[0x10] = '\0';
  local_50[0x11] = '\0';
  local_50[0x12] = '\0';
  local_50[0x13] = '\0';
  local_50[4] = '\0';
  local_50[5] = '\0';
  local_50[6] = '\0';
  local_50[7] = '\0';
  local_50[8] = '\0';
  local_50[9] = '\0';
  local_50[10] = '\0';
  local_50[0xb] = '\0';
  local_50[0] = '\x02';
  local_50[1] = '\0';
  local_50[2] = '\0';
  local_50[3] = '\0';
  QMessageLogger::warning(local_50,pcVar8);
LAB_005c7214:
  if (*(long *)(in_FS_OFFSET + 0x28) == local_30) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QGraphicsWidget::setTabOrder(QGraphicsWidget *first, QGraphicsWidget *second)
{
    if (!first && !second) {
        qWarning("QGraphicsWidget::setTabOrder(0, 0) is undefined");
        return;
    }
    if ((first && second) && first->scene() != second->scene()) {
        qWarning("QGraphicsWidget::setTabOrder: scenes %p and %p are different",
                 first->scene(), second->scene());
        return;
    }
    QGraphicsScene *scene = first ? first->scene() : second->scene();
    if (!scene) {
        qWarning("QGraphicsWidget::setTabOrder: assigning tab order from/to the"
                 " scene requires the item to be in a scene.");
        return;
    }

    // If either first or second are 0, the scene's tabFocusFirst is updated
    // to point to the first item in the scene's focus chain. Then first or
    // second are set to point to tabFocusFirst.
    QGraphicsScenePrivate *sceneD = scene->d_func();
    if (!first) {
        sceneD->tabFocusFirst = second;
        return;
    }
    if (!second) {
        sceneD->tabFocusFirst = first->d_func()->focusNext;
        return;
    }

    // Both first and second are != 0.
    QGraphicsWidget *firstFocusNext = first->d_func()->focusNext;
    if (firstFocusNext == second) {
        // Nothing to do.
        return;
    }

    // Update the focus chain.
    QGraphicsWidget *secondFocusPrev = second->d_func()->focusPrev;
    QGraphicsWidget *secondFocusNext = second->d_func()->focusNext;
    firstFocusNext->d_func()->focusPrev = second;
    first->d_func()->focusNext = second;
    second->d_func()->focusNext = firstFocusNext;
    second->d_func()->focusPrev = first;
    secondFocusPrev->d_func()->focusNext = secondFocusNext;
    secondFocusNext->d_func()->focusPrev = secondFocusPrev;

    Q_ASSERT(first->d_func()->focusNext->d_func()->focusPrev == first);
    Q_ASSERT(first->d_func()->focusPrev->d_func()->focusNext == first);

    Q_ASSERT(second->d_func()->focusNext->d_func()->focusPrev == second);
    Q_ASSERT(second->d_func()->focusPrev->d_func()->focusNext == second);

}